

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::alphaHullInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction,
          int frame)

{
  RealType RVar1;
  _func_void__Op_any_ptr__Arg_ptr *p_Var2;
  char *pcVar3;
  int iVar4;
  type_info *ptVar5;
  float *pfVar6;
  int *piVar7;
  float fVar8;
  any alphaSpec;
  _Arg __arg;
  any local_98;
  _Arg local_88;
  undefined8 uStack_80;
  long local_78 [2];
  _Arg local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Arg local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  createSelectionSets((SelectionSet *)&local_68,this);
  local_98._M_storage._M_ptr = (void *)0x0;
  p_Var2 = (instruction->value)._M_manager;
  if (p_Var2 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    local_98._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  else {
    local_88._M_obj = &local_98;
    (*p_Var2)(_Op_clone,&instruction->value,&local_88);
  }
  ptVar5 = std::any::type(&local_98);
  pcVar3 = *(char **)(ptVar5 + 8);
  if (pcVar3 == _str) {
LAB_0021eb1e:
    pfVar6 = (float *)std::__any_caster<float>(&local_98);
    if (pfVar6 == (float *)0x0) goto LAB_0021ec36;
    fVar8 = *pfVar6;
    goto LAB_0021eb4a;
  }
  if (*pcVar3 != '*') {
    iVar4 = strcmp(pcVar3,_str);
    if (iVar4 == 0) goto LAB_0021eb1e;
  }
  ptVar5 = std::any::type(&local_98);
  pcVar3 = *(char **)(ptVar5 + 8);
  if (pcVar3 == _put) {
LAB_0021eb35:
    piVar7 = (int *)std::__any_caster<int>(&local_98);
    if (piVar7 == (int *)0x0) {
LAB_0021ec36:
      std::__throw_bad_any_cast();
    }
    fVar8 = (float)*piVar7;
  }
  else {
    if (*pcVar3 != '*') {
      iVar4 = strcmp(pcVar3,_put);
      if (iVar4 == 0) goto LAB_0021eb35;
    }
    local_88._M_obj = local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"casting error in alphaHullInstruction","");
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_88._M_obj);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((long *)local_88._M_obj != local_78) {
      operator_delete(local_88._M_obj,local_78[0] + 1);
    }
    SelectionSet::clearAll((SelectionSet *)&local_68);
    fVar8 = 0.0;
  }
LAB_0021eb4a:
  AlphaHullFinder::setAlpha(&this->alphaHullFinder,(double)fVar8);
  HullFinder::findHull((SelectionSet *)&local_48,&(this->alphaHullFinder).super_HullFinder,frame);
  local_78[0] = local_58;
  uStack_80 = uStack_60;
  local_88 = local_68;
  local_68 = local_48;
  uStack_60 = uStack_40;
  local_58 = local_38;
  local_48._M_obj = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_88);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_48);
  RVar1 = (this->alphaHullFinder).super_HullFinder.volume_;
  this->surfaceArea_ = (this->alphaHullFinder).super_HullFinder.surfaceArea_;
  this->hasSurfaceArea_ = true;
  this->volume_ = RVar1;
  this->hasVolume_ = true;
  SelectionSet::parallelReduce(__return_storage_ptr__,(SelectionSet *)&local_68);
  if (local_98._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_98._M_manager)(_Op_destroy,&local_98,(_Arg *)0x0);
    local_98._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::alphaHullInstruction(
      const Token& instruction, int frame) {
    SelectionSet bs = createSelectionSets();

    std::any alphaSpec = instruction.value;
    float alpha(0.0);
    if (alphaSpec.type() == typeid(float)) {
      alpha = std::any_cast<float>(alphaSpec);
    } else if (alphaSpec.type() == typeid(int)) {
      alpha = std::any_cast<int>(alphaSpec);
    } else {
      evalError("casting error in alphaHullInstruction");
      bs.clearAll();
    }

    alphaHullFinder.setAlpha(alpha);
    bs              = alphaHullFinder.findHull(frame);
    surfaceArea_    = alphaHullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = alphaHullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }